

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::addKernelInfo(CLIntercept *this,cl_kernel kernel,cl_kernel source_kernel)

{
  mutex *__mutex;
  uint64_t uVar1;
  uint uVar2;
  int iVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  undefined8 uVar6;
  cl_kernel local_28;
  cl_kernel local_20;
  
  __mutex = &this->m_Mutex;
  local_28 = source_kernel;
  local_20 = kernel;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    pmVar4 = std::
             map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
             ::operator[](&this->m_KernelInfoMap,&local_28);
    pmVar5 = std::
             map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
             ::operator[](&this->m_KernelInfoMap,&local_20);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    uVar2 = pmVar4->CompileCount;
    pmVar5->ProgramNumber = pmVar4->ProgramNumber;
    pmVar5->CompileCount = uVar2;
    uVar1 = pmVar4->OptionsHash;
    pmVar5->ProgramHash = pmVar4->ProgramHash;
    pmVar5->OptionsHash = uVar1;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar6 = std::__throw_system_error(iVar3);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar6);
}

Assistant:

void CLIntercept::addKernelInfo(
    const cl_kernel kernel,
    const cl_kernel source_kernel )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    m_KernelInfoMap[ kernel ] = m_KernelInfoMap[ source_kernel ];
}